

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec.cpp
# Opt level: O0

void mpp_dec_put_frame(Mpp *mpp,RK_S32 index,HalDecTaskFlag flags)

{
  MppBufSlots pvVar1;
  uint v;
  uint v_00;
  RK_U32 RVar2;
  ulong uVar3;
  RK_S64 RVar4;
  MppBuffer pvVar5;
  byte bVar6;
  __sighandler_t __handler;
  MppFrame *data;
  int local_204;
  list_head *local_1f0;
  bool local_1e1;
  MppFrame local_1e0;
  MppFrame out;
  mpp_list *list;
  MppBuffer buffer;
  HalDecVprocTask **ppHStack_1c0;
  MPP_RET ret_2;
  HalDecVprocTask *vproc_task_1;
  HalTaskInfo task_1;
  HalTaskHnd hnd_1;
  HalTaskGroup group_1;
  list_head *local_120;
  list_head *pos__;
  list_head *head__;
  MppPktTs *pkt_ts;
  HalDecVprocTask **ppHStack_100;
  MPP_RET ret_1;
  HalDecVprocTask *vproc_task;
  HalTaskInfo task;
  HalTaskHnd hnd;
  HalTaskGroup group;
  undefined1 auStack_60 [4];
  MPP_RET ret;
  MppDecVprocCfg cfg;
  RK_U32 mode;
  RK_U32 fake_frame;
  RK_U32 refer;
  RK_U32 error;
  RK_U32 change;
  RK_U32 eos;
  MppFrame frame;
  MppBufSlots slots;
  MppDecImpl *dec;
  Mpp *pMStack_18;
  RK_S32 index_local;
  Mpp *mpp_local;
  HalDecTaskFlag flags_local;
  
  slots = mpp->mDec;
  frame = *(MppFrame *)((long)slots + 0x30);
  _change = (MppFrame)0x0;
  v = (uint)flags.val & 1;
  uVar3 = flags.val >> 1;
  v_00 = (uint)uVar3 & 1;
  local_1e1 = (flags.val >> 2 & 1) != 0 || (flags.val >> 3 & 1) != 0;
  cfg.task_group._4_4_ = 0;
  bVar6 = (byte)v;
  dec._4_4_ = index;
  pMStack_18 = mpp;
  mpp_local = (Mpp *)flags;
  if (index < 0) {
    if (((flags.val & 1) == 0) &&
       (_mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,"eos",
                   "mpp_dec_put_frame",0x101), (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    if (((uVar3 & 1) != 0) &&
       (_mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,"!change",
                   "mpp_dec_put_frame",0x102), (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    if (*(long *)((long)slots + 0x218) != 0) {
      hnd = *(HalTaskHnd *)((long)slots + 0x80);
      task._120_8_ = 0;
      ppHStack_100 = &vproc_task;
      pkt_ts._4_4_ = MPP_OK;
      do {
        pkt_ts._4_4_ = hal_task_get_hnd(hnd,0,(HalTaskHnd *)(task.dec.refer + 0x10));
        if (pkt_ts._4_4_ != MPP_OK) {
          if (*(int *)((long)slots + 0x1a8) != 0) {
            return;
          }
          usleep(10000);
        }
      } while (pkt_ts._4_4_ != MPP_OK);
      *(undefined4 *)ppHStack_100 = 0;
      *(byte *)ppHStack_100 = *(byte *)ppHStack_100 & 0xfe | bVar6;
      *(RK_S32 *)((long)ppHStack_100 + 4) = dec._4_4_;
      hal_task_hnd_set_info((HalTaskHnd)task._120_8_,&vproc_task);
      hal_task_hnd_set_status((HalTaskHnd)task._120_8_,1);
      dec_vproc_signal(*(MppDecVprocCtx *)((long)slots + 0x218));
      return;
    }
    mpp_frame_init((MppFrame *)&change);
    cfg.task_group._4_4_ = 1;
    dec._4_4_ = 0;
    mpp_frame_set_eos(_change,v);
  }
  else {
    cfg.task_group._0_4_ = 0;
    mpp_buf_slot_get_prop(frame,index,SLOT_FRAME_PTR,&change);
    cfg.task_group._0_4_ = mpp_frame_get_mode(_change);
    if ((((RK_U32)cfg.task_group != 0) && (*(int *)((long)slots + 0x204) != 0)) &&
       (*(long *)((long)slots + 0x218) == 0)) {
      _auStack_60 = pMStack_18;
      cfg.mpp = (void *)0x0;
      group._4_4_ = dec_vproc_init((MppDecVprocCtx *)((long)slots + 0x218),
                                   (MppDecVprocCfg *)auStack_60);
      if (group._4_4_ == MPP_OK) {
        RVar2 = dec_vproc_get_version(*(MppDecVprocCtx *)((long)slots + 0x218));
        if ((RVar2 == 1) && ((RK_U32)cfg.task_group == 0xc)) {
          mpp_frame_set_mode(_change,0);
          *(uint *)((long)slots + 0xbc) = *(uint *)((long)slots + 0xbc) & 0xfffffffd;
          *(undefined4 *)((long)slots + 0x204) = *(undefined4 *)((long)slots + 0xbc);
          if ((*(long *)((long)slots + 0x218) != 0) && (*(int *)((long)slots + 0x204) == 0)) {
            dec_vproc_deinit(*(MppDecVprocCtx *)((long)slots + 0x218));
            *(undefined8 *)((long)slots + 0x218) = 0;
          }
          *(undefined8 *)((long)slots + 0x218) = 0;
        }
        else {
          dec_vproc_set_mode(*(MppDecVprocCtx *)((long)slots + 0x218),
                             *(MppVprocMode *)((long)slots + 0x204));
          *(void **)((long)slots + 0x80) = cfg.mpp;
          dec_vproc_start(*(MppDecVprocCtx *)((long)slots + 0x218));
        }
      }
      else {
        *(undefined4 *)((long)slots + 0x204) = 0;
        *(undefined8 *)((long)slots + 0x218) = 0;
      }
    }
  }
  if ((dec._4_4_ < 0) &&
     (_mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,"index >= 0",
                 "mpp_dec_put_frame",0x127), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if ((_change == (MppFrame)0x0) &&
     (_mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,"frame",
                 "mpp_dec_put_frame",0x128), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if ((*(int *)((long)slots + 0xb8) != 0) && (*(int *)((long)slots + 0xdc) != 0)) {
    mpp_frame_set_errinfo(_change,0);
    mpp_frame_set_discard(_change,0);
  }
  if (((uVar3 & 1) == 0) && (*(int *)((long)slots + 0xb4) != 0)) {
    mpp_spinlock_lock((spinlock_t *)((long)slots + 0x2a8));
    pos__ = (list_head *)((long)slots + 0x298);
    local_120 = pos__->next;
    local_1f0 = local_120;
    if (local_120 == pos__) {
      local_1f0 = (list_head *)0x0;
    }
    group_1 = local_1f0;
    head__ = local_1f0;
    if (local_1f0 != (list_head *)0x0) {
      list_del_init(local_1f0);
    }
    mpp_spinlock_unlock((spinlock_t *)((long)slots + 0x2a8));
    if (head__ != (list_head *)0x0) {
      mpp_frame_set_dts(_change,(RK_S64)head__[1].prev);
      mpp_frame_set_pts(_change,(RK_S64)head__[1].next);
      mpp_mem_pool_put_f("mpp_dec_put_frame",*(MppMemPool *)((long)slots + 0x290),head__);
    }
  }
  mpp_frame_set_info_change(_change,v_00);
  if (((flags.val & 1) != 0) && (mpp_frame_set_eos(_change,1), local_1e1)) {
    if ((flags.val >> 4 & 1) == 0) {
      mpp_frame_set_discard(_change,1);
    }
    else {
      mpp_frame_set_errinfo(_change,1);
    }
  }
  pvVar1 = slots;
  *(int *)((long)slots + 0x288) = *(int *)((long)slots + 0x288) + 1;
  if ((mpp_dec_debug & 0x20) != 0) {
    RVar4 = mpp_frame_get_pts(_change);
    pvVar5 = mpp_frame_get_buffer(_change);
    if (pvVar5 == (MppBuffer)0x0) {
      local_204 = -1;
    }
    else {
      pvVar5 = mpp_frame_get_buffer(_change);
      local_204 = mpp_buffer_get_fd_with_caller(pvVar5,"mpp_dec_put_frame");
    }
    _mpp_log_l(4,"mpp_dec","detail: %p put frm pts %llu fd %d\n","mpp_dec_put_frame",pvVar1,RVar4,
               local_204);
  }
  if (*(long *)((long)slots + 0x218) == 0) {
    out = pMStack_18->mFrmOut;
    local_1e0 = (MppFrame)0x0;
    mpp_frame_init(&local_1e0);
    mpp_frame_copy(local_1e0,_change);
    if ((mpp_debug & 2) != 0) {
      RVar4 = mpp_frame_get_pts(local_1e0);
      _mpp_log_l(4,"mpp_dec","output frame pts %lld\n",(char *)0x0,RVar4);
    }
    MppMutexCond::lock((MppMutexCond *)out);
    data = &local_1e0;
    mpp_list::add_at_tail((mpp_list *)out,data,8);
    pMStack_18->mFramePutCount = pMStack_18->mFramePutCount + 1;
    MppMutexCond::signal((MppMutexCond *)out,(int)data,__handler);
    MppMutexCond::unlock((MppMutexCond *)out);
    if (cfg.task_group._4_4_ != 0) {
      mpp_frame_deinit((MppFrame *)&change);
    }
    mpp_dec_callback(slots,MPP_DEC_EVENT_ON_FRM_READY,local_1e0);
  }
  else {
    hnd_1 = *(HalTaskHnd *)((long)slots + 0x80);
    task_1._120_8_ = 0;
    ppHStack_1c0 = &vproc_task_1;
    buffer._4_4_ = MPP_OK;
    do {
      buffer._4_4_ = hal_task_get_hnd(hnd_1,0,(HalTaskHnd *)(task_1.dec.refer + 0x10));
      if (buffer._4_4_ != MPP_OK) {
        if (*(int *)((long)slots + 0x1a8) != 0) {
          list = (mpp_list *)0x0;
          mpp_buf_slot_get_prop(frame,dec._4_4_,SLOT_BUFFER,&list);
          if (list == (mpp_list *)0x0) {
            return;
          }
          mpp_buffer_put_with_caller(list,"mpp_dec_put_frame");
          return;
        }
        usleep(10000);
      }
    } while (buffer._4_4_ != MPP_OK);
    *(byte *)ppHStack_1c0 = *(byte *)ppHStack_1c0 & 0xfe | bVar6;
    *(byte *)ppHStack_1c0 = *(byte *)ppHStack_1c0 & 0xfd | (char)v_00 << 1;
    *(RK_S32 *)((long)ppHStack_1c0 + 4) = dec._4_4_;
    if ((uVar3 & 1) == 0) {
      mpp_buf_slot_set_flag(frame,dec._4_4_,SLOT_QUEUE_USE);
      mpp_buf_slot_enqueue(frame,dec._4_4_,QUEUE_DEINTERLACE);
    }
    hal_task_hnd_set_info((HalTaskHnd)task_1._120_8_,&vproc_task_1);
    hal_task_hnd_set_status((HalTaskHnd)task_1._120_8_,1);
    dec_vproc_signal(*(MppDecVprocCtx *)((long)slots + 0x218));
  }
  return;
}

Assistant:

void mpp_dec_put_frame(Mpp *mpp, RK_S32 index, HalDecTaskFlag flags)
{
    MppDecImpl *dec = (MppDecImpl *)mpp->mDec;
    MppBufSlots slots = dec->frame_slots;
    MppFrame frame = NULL;
    RK_U32 eos = flags.eos;
    RK_U32 change = flags.info_change;
    RK_U32 error = flags.parse_err || flags.ref_err;
    RK_U32 refer = flags.used_for_ref;
    RK_U32 fake_frame = 0;

    if (index >= 0) {
        RK_U32 mode = 0;

        mpp_buf_slot_get_prop(slots, index, SLOT_FRAME_PTR, &frame);

        mode = mpp_frame_get_mode(frame);
        if (mode && dec->enable_deinterlace && NULL == dec->vproc) {
            MppDecVprocCfg cfg = { mpp, NULL };
            MPP_RET ret = dec_vproc_init(&dec->vproc, &cfg);
            if (ret) {
                // When iep is failed to open disable deinterlace function to
                // avoid noisy log.
                dec->enable_deinterlace = 0;
                dec->vproc = NULL;
            } else {
                if (dec_vproc_get_version(dec->vproc) == 1 && mode == MPP_FRAME_FLAG_DEINTERLACED) {
                    mpp_frame_set_mode(frame, MPP_FRAME_FLAG_FRAME);
                    /*iep 1 can't no detect DEINTERLACED, direct disable*/
                    dec->cfg.base.enable_vproc &= (~MPP_VPROC_MODE_DETECTION);
                    dec->enable_deinterlace = dec->cfg.base.enable_vproc;
                    if (dec->vproc && !dec->enable_deinterlace) {
                        dec_vproc_deinit(dec->vproc);
                        dec->vproc = NULL;
                    }
                    dec->vproc = NULL;
                } else {
                    /* store current IEP mode */
                    dec_vproc_set_mode(dec->vproc, (MppVprocMode)dec->enable_deinterlace);

                    dec->vproc_tasks = cfg.task_group;
                    dec_vproc_start(dec->vproc);
                }
            }
        }
    } else {
        // when post-process is needed and eos without slot index case
        // we need to create a slot index for it
        mpp_assert(eos);
        mpp_assert(!change);

        if (dec->vproc) {
            HalTaskGroup group = dec->vproc_tasks;
            HalTaskHnd hnd = NULL;
            HalTaskInfo task;
            HalDecVprocTask *vproc_task = &task.dec_vproc;
            MPP_RET ret = MPP_OK;

            do {
                ret = hal_task_get_hnd(group, TASK_IDLE, &hnd);
                if (ret) {
                    if (dec->reset_flag) {
                        return;
                    } else {
                        msleep(10);
                    }
                }
            } while (ret);
            vproc_task->flags.val = 0;
            vproc_task->flags.eos = eos;
            vproc_task->input = index;

            hal_task_hnd_set_info(hnd, &task);
            hal_task_hnd_set_status(hnd, TASK_PROCESSING);
            dec_vproc_signal(dec->vproc);

            return ;
        } else {
            mpp_frame_init(&frame);
            fake_frame = 1;
            index = 0;
        }

        mpp_frame_set_eos(frame, eos);
    }

    mpp_assert(index >= 0);
    mpp_assert(frame);

    if (dec->cfg.base.disable_error && dec->cfg.base.dis_err_clr_mark) {
        mpp_frame_set_errinfo(frame, 0);
        mpp_frame_set_discard(frame, 0);
    }

    if (!change) {
        if (dec->cfg.base.sort_pts) {
            MppPktTs *pkt_ts;

            mpp_spinlock_lock(&dec->ts_lock);
            pkt_ts = list_first_entry_or_null(&dec->ts_link, MppPktTs, link);
            if (pkt_ts)
                list_del_init(&pkt_ts->link);
            mpp_spinlock_unlock(&dec->ts_lock);
            if (pkt_ts) {
                mpp_frame_set_dts(frame, pkt_ts->dts);
                mpp_frame_set_pts(frame, pkt_ts->pts);
                mpp_mem_pool_put(dec->ts_pool, pkt_ts);
            }
        }
    }
    mpp_frame_set_info_change(frame, change);

    if (eos) {
        mpp_frame_set_eos(frame, 1);
        if (error) {
            if (refer)
                mpp_frame_set_errinfo(frame, 1);
            else
                mpp_frame_set_discard(frame, 1);
        }
    }

    dec->dec_out_frame_count++;
    dec_dbg_detail("detail: %p put frm pts %llu fd %d\n", dec,
                   mpp_frame_get_pts(frame),
                   (NULL == mpp_frame_get_buffer(frame)) ? (-1) :
                   mpp_buffer_get_fd(mpp_frame_get_buffer(frame)));

    if (dec->vproc) {
        HalTaskGroup group = dec->vproc_tasks;
        HalTaskHnd hnd = NULL;
        HalTaskInfo task;
        HalDecVprocTask *vproc_task = &task.dec_vproc;
        MPP_RET ret = MPP_OK;

        do {
            ret = hal_task_get_hnd(group, TASK_IDLE, &hnd);
            if (ret) {
                if (dec->reset_flag) {
                    MppBuffer buffer = NULL;
                    mpp_buf_slot_get_prop(slots, index, SLOT_BUFFER, &buffer);
                    if (buffer)
                        mpp_buffer_put(buffer);
                    return;
                } else {
                    msleep(10);
                }
            }
        } while (ret);

        mpp_assert(ret == MPP_OK);

        vproc_task->flags.eos = eos;
        vproc_task->flags.info_change = change;
        vproc_task->input = index;

        if (!change) {
            mpp_buf_slot_set_flag(slots, index, SLOT_QUEUE_USE);
            mpp_buf_slot_enqueue(slots, index, QUEUE_DEINTERLACE);
        }

        hal_task_hnd_set_info(hnd, &task);
        hal_task_hnd_set_status(hnd, TASK_PROCESSING);

        dec_vproc_signal(dec->vproc);
    } else {
        // direct output -> copy a new MppFrame and output
        mpp_list *list = mpp->mFrmOut;
        MppFrame out = NULL;

        mpp_frame_init(&out);
        mpp_frame_copy(out, frame);

        mpp_dbg_pts("output frame pts %lld\n", mpp_frame_get_pts(out));

        list->lock();
        list->add_at_tail(&out, sizeof(out));
        mpp->mFramePutCount++;
        list->signal();
        list->unlock();

        if (fake_frame)
            mpp_frame_deinit(&frame);

        mpp_dec_callback(dec, MPP_DEC_EVENT_ON_FRM_READY, out);
    }
}